

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

BrandedDecl * __thiscall
capnp::compiler::NodeTranslator::BrandScope::interpretResolve
          (BrandedDecl *__return_storage_ptr__,BrandScope *this,Resolver *resolver,
          ResolveResult *result,Reader source)

{
  undefined4 uVar1;
  void *pvVar2;
  Reader brand;
  Own<capnp::compiler::NodeTranslator::BrandScope> scope;
  ResolvedDecl local_288;
  void *local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  byte local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  Reader local_1c0;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> local_190;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> local_e0;
  
  if (result->tag == 1) {
    pop((BrandScope *)&local_190,(uint64_t)this);
    if ((result->field_1).space[0x28] == '\x01') {
      local_228 = (result->field_1).forceAligned;
      uStack_220 = *(undefined8 *)((long)&result->field_1 + 8);
      local_218 = *(undefined8 *)((long)&result->field_1 + 0x10);
      uStack_210 = *(undefined8 *)((long)&result->field_1 + 0x18);
      local_208 = *(undefined8 *)((long)&result->field_1 + 0x20);
      local_1f8 = *(undefined8 *)((long)&result->field_1 + 0x30);
      uStack_1f0 = *(undefined8 *)((long)&result->field_1 + 0x38);
      local_1e8 = *(undefined8 *)((long)&result->field_1 + 0x40);
      uStack_1e0 = *(undefined8 *)((long)&result->field_1 + 0x48);
      local_1d8 = *(undefined8 *)((long)&result->field_1 + 0x50);
      uStack_1d0 = *(undefined8 *)((long)&result->field_1 + 0x58);
      local_200 = (result->field_1).space[0x28];
      capnp::schema::Brand::Reader::getScopes(&local_1c0,(Reader *)((long)&result->field_1 + 0x30));
      brand.reader.capTable = local_1c0.reader.capTable;
      brand.reader.segment = local_1c0.reader.segment;
      brand.reader.ptr = local_1c0.reader.ptr;
      brand.reader.elementCount = local_1c0.reader.elementCount;
      brand.reader.step = local_1c0.reader.step;
      brand.reader.structDataSize = local_1c0.reader.structDataSize;
      brand.reader.structPointerCount = local_1c0.reader.structPointerCount;
      brand.reader.elementSize = local_1c0.reader.elementSize;
      brand.reader._39_1_ = local_1c0.reader._39_1_;
      brand.reader.nestingLimit = local_1c0.reader.nestingLimit;
      brand.reader._44_4_ = local_1c0.reader._44_4_;
      evaluateBrand((BrandScope *)&local_e0,(Resolver *)local_190.field_1._0_8_,
                    (ResolvedDecl *)resolver,brand,(uint)&local_228);
      kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator=
                ((Own<capnp::compiler::NodeTranslator::BrandScope> *)&local_190,
                 (Own<capnp::compiler::NodeTranslator::BrandScope> *)&local_e0);
      kj::Own<capnp::compiler::NodeTranslator::BrandScope>::dispose
                ((Own<capnp::compiler::NodeTranslator::BrandScope> *)&local_e0);
    }
    else {
      push((BrandScope *)&local_e0,local_190.field_1._0_8_,(uint)*(undefined8 *)&result->field_1);
      kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator=
                ((Own<capnp::compiler::NodeTranslator::BrandScope> *)&local_190,
                 (Own<capnp::compiler::NodeTranslator::BrandScope> *)&local_e0);
      kj::Own<capnp::compiler::NodeTranslator::BrandScope>::dispose
                ((Own<capnp::compiler::NodeTranslator::BrandScope> *)&local_e0);
    }
    local_288.resolver = *(Resolver **)((long)&result->field_1 + 0x20);
    local_288.id = (uint64_t)(result->field_1).forceAligned;
    local_288._8_8_ = *(undefined8 *)((long)&result->field_1 + 8);
    local_288.scopeId = *(uint64_t *)((long)&result->field_1 + 0x10);
    local_288._24_8_ = *(undefined8 *)((long)&result->field_1 + 0x18);
    local_288.brand.ptr.isSet = (bool)(result->field_1).space[0x28];
    if (local_288.brand.ptr.isSet == true) {
      local_288.brand.ptr.field_1.value._reader.segment =
           (SegmentReader *)*(undefined8 *)((long)&result->field_1 + 0x30);
      local_288.brand.ptr.field_1.value._reader.capTable =
           (CapTableReader *)*(undefined8 *)((long)&result->field_1 + 0x38);
      local_288.brand.ptr.field_1.value._reader.data =
           (void *)*(undefined8 *)((long)&result->field_1 + 0x40);
      local_288.brand.ptr.field_1.value._reader.pointers =
           (WirePointer *)*(undefined8 *)((long)&result->field_1 + 0x48);
      local_288.brand.ptr.field_1._32_8_ = *(undefined8 *)((long)&result->field_1 + 0x50);
      local_288.brand.ptr.field_1._40_8_ = *(undefined8 *)((long)&result->field_1 + 0x58);
    }
    BrandedDecl::BrandedDecl
              (__return_storage_ptr__,&local_288,
               (Own<capnp::compiler::NodeTranslator::BrandScope> *)&local_190,source);
    kj::Own<capnp::compiler::NodeTranslator::BrandScope>::dispose
              ((Own<capnp::compiler::NodeTranslator::BrandScope> *)&local_190);
  }
  else {
    lookupParameter((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)&local_e0,this,resolver,
                    (uint64_t)(result->field_1).forceAligned,*(uint *)((long)&result->field_1 + 8));
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
              (&local_190,&local_e0);
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue(&local_e0);
    if (local_190.isSet == true) {
      BrandedDecl::BrandedDecl(__return_storage_ptr__,&local_190.field_1.value);
    }
    else {
      pvVar2 = (result->field_1).forceAligned;
      uVar1 = *(undefined4 *)((long)&result->field_1 + 8);
      (__return_storage_ptr__->source)._reader.dataSize = source._reader.dataSize;
      (__return_storage_ptr__->source)._reader.pointerCount = source._reader.pointerCount;
      *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = source._reader._38_2_;
      (__return_storage_ptr__->source)._reader.nestingLimit = source._reader.nestingLimit;
      *(undefined4 *)&(__return_storage_ptr__->source)._reader.field_0x2c = source._reader._44_4_;
      (__return_storage_ptr__->source)._reader.data = source._reader.data;
      (__return_storage_ptr__->source)._reader.pointers = source._reader.pointers;
      (__return_storage_ptr__->source)._reader.segment = source._reader.segment;
      (__return_storage_ptr__->source)._reader.capTable = source._reader.capTable;
      (__return_storage_ptr__->brand).disposer = (Disposer *)0x0;
      (__return_storage_ptr__->brand).ptr = (BrandScope *)0x0;
      (__return_storage_ptr__->body).field_1.forceAligned = pvVar2;
      *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 8) = uVar1;
      (__return_storage_ptr__->body).tag = 2;
    }
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue(&local_190);
  }
  return __return_storage_ptr__;
}

Assistant:

NodeTranslator::BrandedDecl NodeTranslator::BrandScope::interpretResolve(
    Resolver& resolver, Resolver::ResolveResult& result, Expression::Reader source) {
  if (result.is<Resolver::ResolvedDecl>()) {
    auto& decl = result.get<Resolver::ResolvedDecl>();

    auto scope = pop(decl.scopeId);
    KJ_IF_MAYBE(brand, decl.brand) {
      scope = scope->evaluateBrand(resolver, decl, brand->getScopes());
    } else {
      scope = scope->push(decl.id, decl.genericParamCount);
    }

    return BrandedDecl(decl, kj::mv(scope), source);
  }